

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

LogEst whereRangeAdjust(WhereTerm *pTerm,LogEst nNew)

{
  short local_14;
  LogEst nRet;
  LogEst nNew_local;
  WhereTerm *pTerm_local;
  
  local_14 = nNew;
  if (pTerm != (WhereTerm *)0x0) {
    if (pTerm->truthProb < 1) {
      local_14 = nNew + pTerm->truthProb;
    }
    else {
      local_14 = nNew + -0x14;
    }
  }
  return local_14;
}

Assistant:

static LogEst whereRangeAdjust(WhereTerm *pTerm, LogEst nNew){
  LogEst nRet = nNew;
  if( pTerm ){
    if( pTerm->truthProb<=0 ){
      nRet += pTerm->truthProb;
    }else if( (pTerm->wtFlags & TERM_VNULL)==0 ){
      nRet -= 20;        assert( 20==sqlite3LogEst(4) );
    }
  }
  return nRet;
}